

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall DACSThinker::StopScriptsFor(DACSThinker *this,AActor *actor)

{
  DLevelScript *pDVar1;
  AActor *pAVar2;
  
  pDVar1 = this->Scripts;
  do {
    if (pDVar1 == (DLevelScript *)0x0) {
      return;
    }
    pAVar2 = (pDVar1->activator).field_0.p;
    if (pAVar2 == (AActor *)0x0) {
LAB_003bc1de:
      pAVar2 = (AActor *)0x0;
    }
    else if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (pDVar1->activator).field_0.p = (AActor *)0x0;
      goto LAB_003bc1de;
    }
    if (pAVar2 == actor) {
      pDVar1->state = SCRIPT_PleaseRemove;
    }
    pDVar1 = pDVar1->next;
  } while( true );
}

Assistant:

void DACSThinker::StopScriptsFor (AActor *actor)
{
	DLevelScript *script = Scripts;

	while (script != NULL)
	{
		DLevelScript *next = script->next;
		if (script->activator == actor)
		{
			script->SetState (DLevelScript::SCRIPT_PleaseRemove);
		}
		script = next;
	}
}